

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

Fl_Type * __thiscall Fl_Menu_Item_Type::make(Fl_Menu_Item_Type *this)

{
  Fl_Type *pFVar1;
  int iVar2;
  Fl_Button *pFVar3;
  char *n;
  Fl_Type *local_a0;
  Fl_Menu_Item_Type *t;
  Fl_Type *local_28;
  Fl_Type *p;
  Fl_Type *q;
  Fl_Menu_Item_Type *this_local;
  
  pFVar1 = Fl_Type::current;
  local_28 = Fl_Type::current;
  if ((Fl_Type::current != (Fl_Type *)0x0) &&
     (((force_parent != 0 && (iVar2 = (*Fl_Type::current->_vptr_Fl_Type[0x1e])(), iVar2 != 0)) ||
      (iVar2 = (*pFVar1->_vptr_Fl_Type[0x16])(), iVar2 == 0)))) {
    local_28 = pFVar1->parent;
  }
  force_parent = 0;
  if ((local_28 == (Fl_Type *)0x0) ||
     ((iVar2 = (*local_28->_vptr_Fl_Type[0x1f])(), iVar2 == 0 &&
      ((iVar2 = (*local_28->_vptr_Fl_Type[0x1e])(), iVar2 == 0 ||
       (iVar2 = (*local_28->_vptr_Fl_Type[0x16])(), iVar2 == 0)))))) {
    fl_message("Please select a menu to add to");
    this_local = (Fl_Menu_Item_Type *)0x0;
  }
  else {
    if ((this->super_Fl_Widget_Type).o == (Fl_Widget *)0x0) {
      pFVar3 = (Fl_Button *)operator_new(0x80);
      Fl_Button::Fl_Button(pFVar3,0,0,100,0x14,(char *)0x0);
      (this->super_Fl_Widget_Type).o = (Fl_Widget *)pFVar3;
      Fl_Widget::labelsize((this->super_Fl_Widget_Type).o,Fl_Widget_Type::default_size);
    }
    if (submenuflag == '\0') {
      local_a0 = (Fl_Type *)operator_new(0xf0);
      *(Fluid_Image **)&local_a0[1].code_position = (Fluid_Image *)0x0;
      *(Fluid_Image **)&local_a0[1].code_position_end = (Fluid_Image *)0x0;
      local_a0[1].prev = (Fl_Type *)0x0;
      local_a0[1].factory = (Fl_Type *)0x0;
      *(Fl_Widget **)&local_a0[1].level = (Fl_Widget *)0x0;
      local_a0[1].next = (Fl_Type *)0x0;
      local_a0[1].parent = (Fl_Type *)0x0;
      *(undefined8 *)&local_a0[1].new_selected = 0;
      local_a0[1].user_data_type_ = (char *)0x0;
      local_a0[1].comment_ = (char *)0x0;
      local_a0[1].callback_ = (char *)0x0;
      local_a0[1].user_data_ = (char *)0x0;
      local_a0[1].name_ = (char *)0x0;
      local_a0[1].label_ = (char *)0x0;
      local_a0->code_position_end = 0;
      local_a0->header_position_end = 0;
      local_a0[1]._vptr_Fl_Type = (_func_int **)0x0;
      local_a0->factory = (Fl_Type *)0x0;
      local_a0->code_position = 0;
      local_a0->header_position = 0;
      local_a0->next = (Fl_Type *)0x0;
      local_a0->prev = (Fl_Type *)0x0;
      local_a0->new_selected = '\0';
      local_a0->selected = '\0';
      local_a0->open_ = '\0';
      local_a0->visible = '\0';
      local_a0->rtti = '\0';
      *(undefined3 *)&local_a0->field_0x45 = 0;
      *(undefined8 *)&local_a0->level = 0;
      local_a0->comment_ = (char *)0x0;
      local_a0->parent = (Fl_Type *)0x0;
      local_a0->user_data_ = (char *)0x0;
      local_a0->user_data_type_ = (char *)0x0;
      local_a0->label_ = (char *)0x0;
      local_a0->callback_ = (char *)0x0;
      (((Fl_Widget_Type *)&local_a0->_vptr_Fl_Type)->super_Fl_Type)._vptr_Fl_Type =
           (_func_int **)0x0;
      local_a0->name_ = (char *)0x0;
      Fl_Menu_Item_Type((Fl_Menu_Item_Type *)local_a0);
    }
    else {
      local_a0 = (Fl_Type *)operator_new(0xf0);
      *(Fluid_Image **)&local_a0[1].code_position = (Fluid_Image *)0x0;
      *(Fluid_Image **)&local_a0[1].code_position_end = (Fluid_Image *)0x0;
      local_a0[1].prev = (Fl_Type *)0x0;
      local_a0[1].factory = (Fl_Type *)0x0;
      *(Fl_Widget **)&local_a0[1].level = (Fl_Widget *)0x0;
      local_a0[1].next = (Fl_Type *)0x0;
      local_a0[1].parent = (Fl_Type *)0x0;
      *(undefined8 *)&local_a0[1].new_selected = 0;
      local_a0[1].user_data_type_ = (char *)0x0;
      local_a0[1].comment_ = (char *)0x0;
      local_a0[1].callback_ = (char *)0x0;
      local_a0[1].user_data_ = (char *)0x0;
      local_a0[1].name_ = (char *)0x0;
      local_a0[1].label_ = (char *)0x0;
      local_a0->code_position_end = 0;
      local_a0->header_position_end = 0;
      local_a0[1]._vptr_Fl_Type = (_func_int **)0x0;
      local_a0->factory = (Fl_Type *)0x0;
      local_a0->code_position = 0;
      local_a0->header_position = 0;
      local_a0->next = (Fl_Type *)0x0;
      local_a0->prev = (Fl_Type *)0x0;
      local_a0->new_selected = '\0';
      local_a0->selected = '\0';
      local_a0->open_ = '\0';
      local_a0->visible = '\0';
      local_a0->rtti = '\0';
      *(undefined3 *)&local_a0->field_0x45 = 0;
      *(undefined8 *)&local_a0->level = 0;
      local_a0->comment_ = (char *)0x0;
      local_a0->parent = (Fl_Type *)0x0;
      local_a0->user_data_ = (char *)0x0;
      local_a0->user_data_type_ = (char *)0x0;
      local_a0->label_ = (char *)0x0;
      local_a0->callback_ = (char *)0x0;
      (((Fl_Menu_Item_Type *)&local_a0->_vptr_Fl_Type)->super_Fl_Widget_Type).super_Fl_Type.
      _vptr_Fl_Type = (_func_int **)0x0;
      local_a0->name_ = (char *)0x0;
      Fl_Submenu_Type::Fl_Submenu_Type((Fl_Submenu_Type *)local_a0);
    }
    pFVar3 = (Fl_Button *)operator_new(0x80);
    Fl_Button::Fl_Button(pFVar3,0,0,100,0x14,(char *)0x0);
    local_a0[1].prev = (Fl_Type *)pFVar3;
    local_a0->factory = (Fl_Type *)this;
    Fl_Type::add(local_a0,local_28);
    if (reading_file == 0) {
      n = "item";
      if (submenuflag != '\0') {
        n = "submenu";
      }
      Fl_Type::label(local_a0,n);
    }
    this_local = (Fl_Menu_Item_Type *)local_a0;
  }
  return (Fl_Type *)this_local;
}

Assistant:

Fl_Type *Fl_Menu_Item_Type::make() {
  // Find the current menu item:
  Fl_Type* q = Fl_Type::current;
  Fl_Type* p = q;
  if (p) {
    if ( (force_parent && q->is_menu_item()) || !q->is_parent()) p = p->parent;
  }
  force_parent = 0;
  if (!p || !(p->is_menu_button() || (p->is_menu_item() && p->is_parent()))) {
    fl_message("Please select a menu to add to");
    return 0;
  }
  if (!o) {
    o = new Fl_Button(0,0,100,20); // create template widget
    o->labelsize(Fl_Widget_Type::default_size);
  }

  Fl_Menu_Item_Type* t = submenuflag ? new Fl_Submenu_Type() : new Fl_Menu_Item_Type();
  t->o = new Fl_Button(0,0,100,20);
  t->factory = this;
  t->add(p);
  if (!reading_file) t->label(submenuflag ? "submenu" : "item");
  return t;
}